

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O0

CEAngle CESkyCoord::AngularSeparation
                  (CEAngle *xcoord_first,CEAngle *ycoord_first,CEAngle *xcoord_second,
                  CEAngle *ycoord_second)

{
  CEAngle *in_RCX;
  CEAngle *in_RDX;
  CEAngle *in_RSI;
  _func_int **in_RDI;
  CEAngle *in_R8;
  double dVar1;
  CEAngle *this;
  double dVar2;
  double dVar3;
  double extraout_XMM0_Qa;
  CEAngle CVar4;
  double *in_stack_ffffffffffffffa8;
  CEAngle local_40;
  double local_30;
  CEAngle *local_28;
  CEAngle *local_20;
  CEAngle *local_18;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  dVar1 = CEAngle::operator_cast_to_double(in_RSI);
  this = (CEAngle *)CEAngle::operator_cast_to_double(local_18);
  dVar2 = CEAngle::operator_cast_to_double(local_20);
  dVar3 = CEAngle::operator_cast_to_double(local_28);
  iauSeps(dVar1,this,dVar2,SUB84(dVar3,0));
  CEAngle::Rad(in_stack_ffffffffffffffa8);
  local_30 = CEAngle::operator_cast_to_double(&local_40);
  CEAngle::CEAngle(this,(double *)in_RDI);
  CEAngle::~CEAngle((CEAngle *)0x13df83);
  CVar4.angle_ = extraout_XMM0_Qa;
  CVar4._vptr_CEAngle = in_RDI;
  return CVar4;
}

Assistant:

CEAngle CESkyCoord::AngularSeparation(const CEAngle& xcoord_first, 
                                      const CEAngle& ycoord_first,
                                      const CEAngle& xcoord_second, 
                                      const CEAngle& ycoord_second)
{
    // Call the 'iauSeps' SOFA algorithm
    return CEAngle::Rad(iauSeps(xcoord_first, ycoord_first,
                                xcoord_second, ycoord_second));
}